

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O1

int (anonymous_namespace)::store_int<int,char>(int *out,char *val,int min,int max)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  char *end;
  char *local_30;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  *piVar1 = 0;
  lVar2 = strtol(val,&local_30,10);
  if (((lVar2 != 0) || (iVar3 = 3, *piVar1 == 0)) &&
     (iVar3 = 2, lVar2 <= (long)(ulong)(uint)max && (long)(ulong)(uint)min <= lVar2)) {
    *out = (int)lVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int store_int(INT_T *out, const CHAR_T *val, INT_T min, INT_T max)
{
    errno = 0;
    long val_as_long = to_long(val);
    if (val_as_long == 0 && errno != 0)
        return __CILKRTS_SET_PARAM_INVALID;
    if (val_as_long < min || val_as_long == LONG_MIN)
        return __CILKRTS_SET_PARAM_XRANGE;
    else if (val_as_long > max || val_as_long == LONG_MAX)
        return __CILKRTS_SET_PARAM_XRANGE;

    *out = val_as_long;
    return __CILKRTS_SET_PARAM_SUCCESS;
}